

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_helpers.cpp
# Opt level: O0

string * decapitalize(string *__return_storage_ptr__,string *s,int pos)

{
  byte *pbVar1;
  int pos_local;
  string *s_local;
  string *ret;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)s);
  pbVar1 = (byte *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
  *pbVar1 = *pbVar1 | 0x20;
  return __return_storage_ptr__;
}

Assistant:

std::string decapitalize(const std::string &s, int pos) {
  std::string ret = s;
  ret[pos] |= 32;
  return ret;
}